

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O3

void GetCompileDefinitionsAndDirectories
               (cmGeneratorTarget *target,string *config,string *incs,string *defs)

{
  pointer pcVar1;
  pointer pbVar2;
  cmLocalGenerator *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  string *local_38;
  
  local_38 = defs;
  this = cmGeneratorTarget::GetLocalGenerator(target);
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"CXX","");
  cmLocalGenerator::GetIncludeDirectories
            (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88,target,(string *)local_68,config,false);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)local_68,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88,";");
  std::__cxx11::string::operator=((string *)incs,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  local_68._24_8_ = local_68 + 8;
  local_68._8_4_ = _S_red;
  local_68._16_8_ = 0;
  local_40 = 0;
  pbVar2 = (pointer)(local_88 + 0x10);
  local_88._0_8_ = pbVar2;
  local_48 = (_Base_ptr)local_68._24_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CXX","");
  cmLocalGenerator::AddCompileDefinitions
            (this,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,target,config,(string *)local_88);
  if ((pointer)local_88._0_8_ != pbVar2) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
  cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            ((string *)local_88,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,";");
  std::__cxx11::string::_M_append((char *)local_38,local_88._0_8_);
  if ((pointer)local_88._0_8_ != pbVar2) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
  return;
}

Assistant:

static void GetCompileDefinitionsAndDirectories(
  cmGeneratorTarget const* target, const std::string& config,
  std::string& incs, std::string& defs)
{
  cmLocalGenerator* localGen = target->GetLocalGenerator();
  {
    std::vector<std::string> includeDirs;
    // Get the include dirs for this target, without stripping the implicit
    // include dirs off, see
    // https://gitlab.kitware.com/cmake/cmake/issues/13667
    localGen->GetIncludeDirectories(includeDirs, target, "CXX", config, false);
    incs = cmJoin(includeDirs, ";");
  }
  {
    std::set<std::string> defines;
    localGen->AddCompileDefinitions(defines, target, config, "CXX");
    defs += cmJoin(defines, ";");
  }
}